

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_refcounted.hpp
# Opt level: O3

intrusive_ptr_t<so_5::message_t> * __thiscall
so_5::intrusive_ptr_t<so_5::message_t>::operator=
          (intrusive_ptr_t<so_5::message_t> *this,intrusive_ptr_t<so_5::message_t> *o)

{
  atomic_refcounted_t *paVar1;
  
  if (o != this) {
    if (this->m_obj != (message_t *)0x0) {
      LOCK();
      paVar1 = &this->m_obj->super_atomic_refcounted_t;
      (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
           (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
      UNLOCK();
      if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
         (this->m_obj != (message_t *)0x0)) {
        (*this->m_obj->_vptr_message_t[1])();
      }
      this->m_obj = (message_t *)0x0;
    }
    this->m_obj = o->m_obj;
    o->m_obj = (message_t *)0x0;
  }
  return this;
}

Assistant:

intrusive_ptr_t &
		operator=( intrusive_ptr_t && o )
		{
			if( &o != this )
			{
				dismiss_object();
				m_obj = o.m_obj;
				o.m_obj = nullptr;
			}
			return *this;
		}